

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_to_hex_or_txid(wally_tx *tx,uint32_t flags,char **output,uchar *bytes_out,size_t len,
                     _Bool is_elements)

{
  int local_864;
  size_t sStack_860;
  int ret;
  size_t written;
  size_t n;
  uchar *buff_p;
  uchar buff [2048];
  _Bool is_elements_local;
  size_t len_local;
  uchar *bytes_out_local;
  char **output_local;
  uint32_t flags_local;
  wally_tx *tx_local;
  
  n = (size_t)&buff_p;
  if (((output == (char **)0x0) ||
      ((*output = (char *)0x0, bytes_out == (uchar *)0x0 && (len == 0)))) &&
     ((output != (char **)0x0 || ((bytes_out != (uchar *)0x0 && (len == 0x20)))))) {
    local_864 = tx_to_bytes(tx,(tx_serialize_opts *)0x0,flags,(uchar *)n,0x800,&written,is_elements)
    ;
    if (local_864 == 0) {
      if (0x800 < written) {
        n = (size_t)wally_malloc(written);
        if ((uchar *)n == (uchar *)0x0) {
          return -3;
        }
        local_864 = tx_to_bytes(tx,(tx_serialize_opts *)0x0,flags,(uchar *)n,written,
                                &stack0xfffffffffffff7a0,is_elements);
        if (written != sStack_860) {
          local_864 = -1;
        }
      }
      if (local_864 == 0) {
        if (output == (char **)0x0) {
          local_864 = wally_sha256d((uchar *)n,written,bytes_out,len);
        }
        else {
          local_864 = wally_hex_from_bytes((uchar *)n,written,output);
        }
      }
      wally_clear((void *)n,written);
      if ((uchar **)n != &buff_p) {
        wally_free((void *)n);
      }
    }
    tx_local._4_4_ = local_864;
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

static int tx_to_hex_or_txid(const struct wally_tx *tx, uint32_t flags,
                             char **output,
                             unsigned char *bytes_out, size_t len,
                             bool is_elements)
{
    unsigned char buff[TX_STACK_SIZE], *buff_p = buff;
    size_t n, written;
    int ret;

    if (output)
        *output = NULL;

    if ((output && (bytes_out || len)) ||
        (!output && (!bytes_out || len != WALLY_TXHASH_LEN)))
        return WALLY_EINVAL;

    ret = tx_to_bytes(tx, NULL, flags, buff_p, sizeof(buff), &n, is_elements);
    if (ret == WALLY_OK) {
        if (n > sizeof(buff)) {
            if ((buff_p = wally_malloc(n)) == NULL)
                return WALLY_ENOMEM;
            ret = tx_to_bytes(tx, NULL, flags, buff_p, n, &written, is_elements);
            if (n != written)
                ret = WALLY_ERROR; /* Length calculated incorrectly */
        }
        if (ret == WALLY_OK) {
            if (output)
                ret = wally_hex_from_bytes(buff_p, n, output);
            else
                ret = wally_sha256d(buff_p, n, bytes_out, len);
        }
        wally_clear(buff_p, n);
        if (buff_p != buff)
            wally_free(buff_p);
    }
    return ret;
}